

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void ktx::validateToolInput(istream *stream,string *filepath,Reporter *report)

{
  int iVar1;
  underlying_type_t<ktx::ReturnCode> uVar2;
  ulong uVar3;
  undefined8 uVar4;
  long *in_RDI;
  int validationResult;
  anon_class_1_0_00000001 callback;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_000002b0;
  undefined1 in_stack_000002be;
  undefined1 in_stack_000002bf;
  string *in_stack_000002c0;
  istream *in_stack_000002c8;
  streamoff in_stack_fffffffffffffef8;
  fpos<__mbstate_t> *in_stack_ffffffffffffff00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff08;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_ffffffffffffff10;
  long *plVar5;
  string local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char (*in_stack_ffffffffffffff78) [41];
  undefined4 local_80;
  ReturnCode in_stack_ffffffffffffff84;
  Reporter *in_stack_ffffffffffffff88;
  string local_38 [48];
  long *local_8;
  
  local_8 = in_RDI;
  uVar3 = std::ios::operator!((ios *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  if ((uVar3 & 1) != 0) {
    errnoMessage_abi_cxx11_();
    Reporter::fatal<char_const(&)[35],std::__cxx11::string_const&,std::__cxx11::string>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
               (char (*) [35])in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_38);
  }
  std::function<void(ktx::ValidationReport_const&)>::
  function<ktx::validateToolInput(std::istream&,std::__cxx11::string_const&,ktx::Reporter&)::__0&,void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = validateIOStream(in_stack_000002c8,in_stack_000002c0,(bool)in_stack_000002bf,
                           (bool)in_stack_000002be,in_stack_000002b0);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x2b007e);
  uVar2 = operator+(SUCCESS);
  if (iVar1 == uVar2) {
    plVar5 = local_8;
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::istream::seekg(plVar5,CONCAT44(in_stack_ffffffffffffff84,local_80),
                        in_stack_ffffffffffffff88);
    uVar3 = std::ios::operator!((ios *)((long)local_8 + *(long *)(*local_8 + -0x18)));
    if ((uVar3 & 1) != 0) {
      errnoMessage_abi_cxx11_();
      Reporter::fatal<char_const(&)[41],std::__cxx11::string_const&,std::__cxx11::string>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(local_a0);
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  FatalError::FatalError
            ((FatalError *)in_stack_ffffffffffffff00,
             (ReturnCode)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  __cxa_throw(uVar4,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void validateToolInput(std::istream& stream, const std::string& filepath, Reporter& report) {
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not open input file \"{}\": {}", filepath, errnoMessage());

    auto callback = [&](const ValidationReport& issue) {
        fmt::print(std::cerr, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
        fmt::print(std::cerr, "    {}\n", issue.details);
    };
    const auto validationResult = validateIOStream(stream, filepath, false, false, callback);

    if (validationResult != +rc::SUCCESS)
        throw FatalError(ReturnCode{validationResult});

    stream.seekg(0);
    if (!stream)
        report.fatal(rc::IO_FAILURE, "Could not rewind the input file \"{}\": {}", filepath, errnoMessage());
}